

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltexture.cpp
# Opt level: O0

void __thiscall
QOpenGLTexture::setSwizzleMask
          (QOpenGLTexture *this,SwizzleValue r,SwizzleValue g,SwizzleValue b,SwizzleValue a)

{
  bool bVar1;
  ulong uVar2;
  QOpenGLTexturePrivate *params;
  SwizzleValue in_ECX;
  SwizzleValue in_EDX;
  SwizzleValue in_ESI;
  QOpenGLTextureHelper *in_RDI;
  SwizzleValue in_R8D;
  long in_FS_OFFSET;
  QOpenGLTexturePrivate *d;
  GLint swizzleMask [4];
  undefined4 in_stack_ffffffffffffff78;
  Feature in_stack_ffffffffffffff7c;
  char *in_stack_ffffffffffffff88;
  QOpenGLTextureHelper *this_00;
  char local_58 [32];
  char local_38 [48];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  QOpenGLContext::currentContext();
  uVar2 = QOpenGLContext::isOpenGLES();
  if ((uVar2 & 1) == 0) {
    params = d_func((QOpenGLTexture *)0x18f3ab);
    QOpenGLTexturePrivate::create((QOpenGLTexturePrivate *)CONCAT44(in_ECX,in_R8D));
    bVar1 = QFlags<QOpenGLTexture::Feature>::testFlag
                      ((QFlags<QOpenGLTexture::Feature> *)in_RDI,in_stack_ffffffffffffff7c);
    if (bVar1) {
      params->swizzleMask[0] = in_ESI;
      params->swizzleMask[1] = in_EDX;
      params->swizzleMask[2] = in_ECX;
      params->swizzleMask[3] = in_R8D;
      QOpenGLTextureHelper::glTextureParameteriv
                (this_00,in_ESI,in_EDX,in_ECX,in_R8D,(GLint *)params);
    }
    else {
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)CONCAT44(in_ECX,in_R8D),(char *)params,
                 (int)((ulong)in_RDI >> 0x20),
                 (char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      QMessageLogger::warning(local_38,"QOpenGLTexture::setSwizzleMask() requires OpenGL >= 3.3");
    }
  }
  else {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)CONCAT44(in_ECX,in_R8D),in_stack_ffffffffffffff88,
               (int)((ulong)in_RDI >> 0x20),
               (char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    QMessageLogger::warning(local_58,"QOpenGLTexture: Texture swizzling is not supported");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QOpenGLTexture::setSwizzleMask(SwizzleValue r, SwizzleValue g,
                                    SwizzleValue b, SwizzleValue a)
{
#if !defined(Q_OS_MAC) && !QT_CONFIG(opengles2)
    if (!QOpenGLContext::currentContext()->isOpenGLES()) {
        Q_D(QOpenGLTexture);
        d->create();
        Q_ASSERT(d->texFuncs);
        Q_ASSERT(d->textureId);
        if (!d->features.testFlag(Swizzle)) {
            qWarning("QOpenGLTexture::setSwizzleMask() requires OpenGL >= 3.3");
            return;
        }
        GLint swizzleMask[] = {GLint(r), GLint(g), GLint(b), GLint(a)};
        d->swizzleMask[0] = r;
        d->swizzleMask[1] = g;
        d->swizzleMask[2] = b;
        d->swizzleMask[3] = a;
        d->texFuncs->glTextureParameteriv(d->textureId, d->target, d->bindingTarget, GL_TEXTURE_SWIZZLE_RGBA, swizzleMask);
        return;
    }
#else
    Q_UNUSED(r);
    Q_UNUSED(g);
    Q_UNUSED(b);
    Q_UNUSED(a);
#endif
    qWarning("QOpenGLTexture: Texture swizzling is not supported");
}